

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
OpenMD::Polynomial<double>::FindRealRoots
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,Polynomial<double> *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double local_120;
  double local_118;
  undefined8 uStack_110;
  vector<double,_std::allocator<double>_> cubeRoots;
  double fR1;
  double fR0;
  _Base_ptr p_Stack_d0;
  _Base_ptr local_c8;
  double local_b8;
  undefined8 uStack_b0;
  double fR2;
  Polynomial<double> tempCubic;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = degree(this);
  switch(uVar1) {
  case 1:
    dVar5 = getCoefficient(this,1);
    dVar4 = getCoefficient(this,0);
    tempCubic.polyPairMap_._M_t._M_impl._0_8_ = -dVar4 / dVar5;
    std::vector<double,_std::allocator<double>_>::emplace_back<double>
              (__return_storage_ptr__,(double *)&tempCubic);
    break;
  case 2:
    dVar5 = getCoefficient(this,2);
    dVar4 = getCoefficient(this,1);
    dVar6 = getCoefficient(this,0);
    dVar6 = dVar4 * dVar4 + dVar6 * -4.0 * dVar5;
    dVar6 = (double)(-(ulong)(1e-08 < ABS(dVar6)) & (ulong)dVar6);
    if (0.0 <= dVar6) {
      dVar5 = 0.5 / dVar5;
      if (dVar6 <= 0.0) {
        tempCubic.polyPairMap_._M_t._M_impl._0_8_ = dVar4 * -dVar5;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,(double *)&tempCubic);
      }
      else {
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        tempCubic.polyPairMap_._M_t._M_impl._0_8_ = (-dVar4 - dVar6) * dVar5;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,(double *)&tempCubic);
        tempCubic.polyPairMap_._M_t._M_impl._0_8_ = dVar5 * (dVar6 - dVar4);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,(double *)&tempCubic);
      }
    }
    break;
  case 3:
    dVar5 = getCoefficient(this,3);
    dVar4 = getCoefficient(this,2);
    dVar6 = getCoefficient(this,1);
    dVar7 = getCoefficient(this,0);
    dVar5 = 1.0 / dVar5;
    dVar4 = dVar5 * dVar4;
    dVar8 = dVar4 * 0.3333333333333333;
    dVar7 = (((dVar4 + dVar4) * dVar4 + dVar6 * dVar5 * -9.0) * dVar4 * 0.037037037037037035 +
            dVar7 * dVar5) * 0.5;
    dVar4 = dVar6 * dVar5 - dVar4 * dVar8;
    dVar5 = dVar7 * dVar7 + dVar4 * dVar4 * dVar4 * 0.037037037037037035;
    dVar5 = (double)(-(ulong)(1e-08 < ABS(dVar5)) & (ulong)dVar5);
    if (dVar5 <= 0.0) {
      if (0.0 <= dVar5) {
        if (0.0 <= dVar7) {
          dVar5 = pow(dVar7,0.3333333333333333);
          dVar5 = -dVar5;
        }
        else {
          dVar5 = pow(-dVar7,0.3333333333333333);
        }
        tempCubic.polyPairMap_._M_t._M_impl._0_8_ = (dVar5 + dVar5) - dVar8;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,(double *)&tempCubic);
        tempCubic.polyPairMap_._M_t._M_impl._0_8_ = -dVar5 - dVar8;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,(double *)&tempCubic);
        tempCubic.polyPairMap_._M_t._M_impl._0_8_ = -dVar5 - dVar8;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,(double *)&tempCubic);
      }
      else {
        dVar4 = dVar4 * -0.3333333333333333;
        if (dVar4 < 0.0) {
          dVar4 = sqrt(dVar4);
        }
        else {
          dVar4 = SQRT(dVar4);
        }
        if (-0.0 < dVar5) {
          dVar5 = sqrt(-dVar5);
        }
        else {
          dVar5 = SQRT(-dVar5);
        }
        dVar5 = atan2(dVar5,-dVar7);
        dVar6 = cos(dVar5 * 0.3333333333333333);
        dVar5 = sin(dVar5 * 0.3333333333333333);
        tempCubic.polyPairMap_._M_t._M_impl._0_8_ = (dVar4 + dVar4) * dVar6 - dVar8;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,(double *)&tempCubic);
        tempCubic.polyPairMap_._M_t._M_impl._0_8_ =
             -dVar8 - (dVar5 * 1.7320508075688772 + dVar6) * dVar4;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,(double *)&tempCubic);
        tempCubic.polyPairMap_._M_t._M_impl._0_8_ =
             (dVar5 * -1.7320508075688772 + dVar6) * -dVar4 + -dVar8;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,(double *)&tempCubic);
      }
    }
    else {
      if (dVar5 < 0.0) {
        dVar5 = sqrt(dVar5);
      }
      else {
        dVar5 = SQRT(dVar5);
      }
      dVar4 = dVar5 - dVar7;
      if (0.0 <= dVar4) {
        dVar4 = pow(dVar4,0.3333333333333333);
      }
      else {
        dVar4 = pow(-dVar4,0.3333333333333333);
        dVar4 = -dVar4;
      }
      dVar5 = -dVar7 - dVar5;
      if (0.0 <= dVar5) {
        dVar5 = pow(dVar5,0.3333333333333333);
        dVar4 = dVar5 + dVar4;
      }
      else {
        dVar5 = pow(-dVar5,0.3333333333333333);
        dVar4 = dVar4 - dVar5;
      }
      tempCubic.polyPairMap_._M_t._M_impl._0_8_ = dVar4 - dVar8;
      std::vector<double,_std::allocator<double>_>::push_back
                (__return_storage_ptr__,(value_type_conflict1 *)&tempCubic);
    }
    break;
  case 4:
    dVar4 = getCoefficient(this,4);
    dVar5 = getCoefficient(this,3);
    dVar6 = getCoefficient(this,2);
    dVar7 = getCoefficient(this,1);
    local_b8 = getCoefficient(this,0);
    dVar4 = 1.0 / dVar4;
    local_b8 = local_b8 * dVar4;
    dVar7 = dVar7 * dVar4;
    dVar6 = dVar6 * dVar4;
    dVar4 = dVar4 * dVar5;
    local_118 = -dVar4 * dVar4;
    uStack_110 = 0x8000000000000000;
    fR0 = (local_118 * local_b8 + dVar6 * 4.0 * local_b8) - dVar7 * dVar7;
    local_b8 = local_b8 * -4.0;
    fR1 = dVar4 * dVar7 + local_b8;
    tempCubic.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &tempCubic.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header;
    tempCubic.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    tempCubic.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    tempCubic.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    fR2 = -dVar6;
    tempCubic.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         tempCubic.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    setCoefficient(&tempCubic,0,&fR0);
    setCoefficient(&tempCubic,1,&fR1);
    setCoefficient(&tempCubic,2,&fR2);
    cubeRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)&DAT_3ff0000000000000;
    setCoefficient(&tempCubic,3,(double *)&cubeRoots);
    FindRealRoots(&cubeRoots,&tempCubic);
    dVar5 = *cubeRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar8 = dVar4 * 0.25 * dVar4 + -dVar6 + dVar5;
    dVar8 = (double)(-(ulong)(1e-08 < ABS(dVar8)) & (ulong)dVar8);
    if (dVar8 <= 0.0) {
      if ((0.0 <= dVar8) && (dVar5 = dVar5 * dVar5 + local_b8, -1e-08 <= dVar5)) {
        dVar7 = 0.0;
        if (0.0 <= dVar5) {
          dVar7 = dVar5;
        }
        dVar5 = SQRT(dVar7) + SQRT(dVar7);
        dVar7 = dVar4 * 0.75 * dVar4 - (dVar6 + dVar6);
        dVar6 = dVar7 + dVar5;
        if (1e-08 <= dVar6) {
          local_118 = dVar5;
          if (dVar6 < 0.0) {
            dVar6 = sqrt(dVar6);
          }
          else {
            dVar6 = SQRT(dVar6);
          }
          local_120 = dVar4 * -0.25 + dVar6 * 0.5;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (__return_storage_ptr__,&local_120);
          local_120 = dVar4 * -0.25 - dVar6 * 0.5;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (__return_storage_ptr__,&local_120);
          dVar5 = local_118;
        }
        dVar7 = dVar7 - dVar5;
        if (1e-08 <= dVar7) {
          if (dVar7 < 0.0) {
            dVar7 = sqrt(dVar7);
          }
          else {
            dVar7 = SQRT(dVar7);
          }
          local_120 = dVar4 * -0.25 + dVar7 * 0.5;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (__return_storage_ptr__,&local_120);
          local_120 = dVar4 * -0.25 - dVar7 * 0.5;
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (__return_storage_ptr__,&local_120);
        }
      }
    }
    else {
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      dVar9 = (dVar4 * 0.75 * dVar4 - dVar8 * dVar8) - (dVar6 + dVar6);
      dVar5 = (local_118 * dVar4 + dVar4 * 4.0 * dVar6 + dVar7 * -8.0) / (dVar8 * 4.0);
      dVar6 = (double)(-(ulong)(1e-08 < ABS(dVar5 + dVar9)) & (ulong)(dVar5 + dVar9));
      if (0.0 <= dVar6) {
        uStack_b0 = 0;
        local_118 = dVar5;
        local_b8 = dVar9;
        if (dVar6 < 0.0) {
          dVar6 = sqrt(dVar6);
        }
        else {
          dVar6 = SQRT(dVar6);
        }
        local_120 = (dVar8 + dVar6) * 0.5 + dVar4 * -0.25;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,&local_120);
        local_120 = dVar4 * -0.25 + (dVar8 - dVar6) * 0.5;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,&local_120);
        dVar5 = local_118;
        dVar9 = local_b8;
      }
      dVar5 = (double)(-(ulong)(1e-08 < ABS(dVar9 - dVar5)) & (ulong)(dVar9 - dVar5));
      if (0.0 <= dVar5) {
        if (dVar5 < 0.0) {
          dVar5 = sqrt(dVar5);
        }
        else {
          dVar5 = SQRT(dVar5);
        }
        local_120 = (dVar5 - dVar8) * 0.5 + dVar4 * -0.25;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,&local_120);
        local_120 = dVar4 * -0.25 + (dVar8 + dVar5) * -0.5;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>
                  (__return_storage_ptr__,&local_120);
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&cubeRoots.super__Vector_base<double,_std::allocator<double>_>);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 *)&tempCubic);
    break;
  default:
    CreateCompanion((Polynomial<double> *)&fR1);
    JAMA::Eigenvalue<double>::Eigenvalue
              ((Eigenvalue<double> *)&tempCubic,(DynamicRectMatrix<double> *)&fR1);
    cubeRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    cubeRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    cubeRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    fR0 = 0.0;
    p_Stack_d0 = (_Base_ptr)0x0;
    local_c8 = (_Base_ptr)0x0;
    JAMA::Eigenvalue<double>::getRealEigenvalues
              ((Eigenvalue<double> *)&tempCubic,
               (DynamicVector<double,_std::allocator<double>_> *)&cubeRoots);
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)&fR0,
               (vector<double,_std::allocator<double>_> *)
               &tempCubic.polyPairMap_._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    uVar2 = 0;
    uVar3 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 * 8 != uVar2; uVar2 = uVar2 + 8) {
      if (ABS(*(double *)((long)fR0 + uVar2)) < 1e-08) {
        std::vector<double,_std::allocator<double>_>::push_back
                  (__return_storage_ptr__,
                   (value_type_conflict1 *)
                   ((long)cubeRoots.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start + uVar2));
      }
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&fR0);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&cubeRoots.super__Vector_base<double,_std::allocator<double>_>);
    JAMA::Eigenvalue<double>::~Eigenvalue((Eigenvalue<double> *)&tempCubic);
    DynamicRectMatrix<double>::deallocate((DynamicRectMatrix<double> *)&fR1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Real> FindRealRoots() {
      const Real fEpsilon = 1.0e-8;
      std::vector<Real> roots;
      roots.clear();

      const int deg = degree();

      switch (deg) {
      case 1: {
        Real fC1 = getCoefficient(1);
        Real fC0 = getCoefficient(0);
        roots.push_back(-fC0 / fC1);
        return roots;
      }
      case 2: {
        Real fC2    = getCoefficient(2);
        Real fC1    = getCoefficient(1);
        Real fC0    = getCoefficient(0);
        Real fDiscr = fC1 * fC1 - 4.0 * fC0 * fC2;
        if (abs(fDiscr) <= fEpsilon) { fDiscr = (Real)0.0; }

        if (fDiscr < (Real)0.0) {  // complex roots only
          return roots;
        }

        Real fTmp = ((Real)0.5) / fC2;

        if (fDiscr > (Real)0.0) {  // 2 real roots
          fDiscr = sqrt(fDiscr);
          roots.push_back(fTmp * (-fC1 - fDiscr));
          roots.push_back(fTmp * (-fC1 + fDiscr));
        } else {
          roots.push_back(-fTmp * fC1);  // 1 real root
        }
      }
        return roots;
      case 3: {
        Real fC3 = getCoefficient(3);
        Real fC2 = getCoefficient(2);
        Real fC1 = getCoefficient(1);
        Real fC0 = getCoefficient(0);

        // make polynomial monic, x^3+c2*x^2+c1*x+c0
        Real fInvC3 = ((Real)1.0) / fC3;
        fC0 *= fInvC3;
        fC1 *= fInvC3;
        fC2 *= fInvC3;

        // convert to y^3+a*y+b = 0 by x = y-c2/3
        const Real fThird         = (Real)1.0 / (Real)3.0;
        const Real fTwentySeventh = (Real)1.0 / (Real)27.0;
        Real fOffset              = fThird * fC2;
        Real fA                   = fC1 - fC2 * fOffset;
        Real fB = fC0 + fC2 * (((Real)2.0) * fC2 * fC2 - ((Real)9.0) * fC1) *
                            fTwentySeventh;
        Real fHalfB = ((Real)0.5) * fB;

        Real fDiscr = fHalfB * fHalfB + fA * fA * fA * fTwentySeventh;
        if (fabs(fDiscr) <= fEpsilon) { fDiscr = (Real)0.0; }

        if (fDiscr > (Real)0.0) {  // 1 real, 2 complex roots

          fDiscr     = sqrt(fDiscr);
          Real fTemp = -fHalfB + fDiscr;
          Real root;
          if (fTemp >= (Real)0.0) {
            root = pow(fTemp, fThird);
          } else {
            root = -pow(-fTemp, fThird);
          }
          fTemp = -fHalfB - fDiscr;
          if (fTemp >= (Real)0.0) {
            root += pow(fTemp, fThird);
          } else {
            root -= pow(-fTemp, fThird);
          }
          root -= fOffset;

          roots.push_back(root);
        } else if (fDiscr < (Real)0.0) {
          const Real fSqrt3 = sqrt((Real)3.0);
          Real fDist        = sqrt(-fThird * fA);
          Real fAngle       = fThird * atan2(sqrt(-fDiscr), -fHalfB);
          Real fCos         = cos(fAngle);
          Real fSin         = sin(fAngle);
          roots.push_back(((Real)2.0) * fDist * fCos - fOffset);
          roots.push_back(-fDist * (fCos + fSqrt3 * fSin) - fOffset);
          roots.push_back(-fDist * (fCos - fSqrt3 * fSin) - fOffset);
        } else {
          Real fTemp;
          if (fHalfB >= (Real)0.0) {
            fTemp = -pow(fHalfB, fThird);
          } else {
            fTemp = pow(-fHalfB, fThird);
          }
          roots.push_back(((Real)2.0) * fTemp - fOffset);
          roots.push_back(-fTemp - fOffset);
          roots.push_back(-fTemp - fOffset);
        }
      }
        return roots;
      case 4: {
        Real fC4 = getCoefficient(4);
        Real fC3 = getCoefficient(3);
        Real fC2 = getCoefficient(2);
        Real fC1 = getCoefficient(1);
        Real fC0 = getCoefficient(0);

        // make polynomial monic, x^4+c3*x^3+c2*x^2+c1*x+c0
        Real fInvC4 = ((Real)1.0) / fC4;
        fC0 *= fInvC4;
        fC1 *= fInvC4;
        fC2 *= fInvC4;
        fC3 *= fInvC4;

        // reduction to resolvent cubic polynomial y^3+r2*y^2+r1*y+r0 = 0
        Real fR0 = -fC3 * fC3 * fC0 + ((Real)4.0) * fC2 * fC0 - fC1 * fC1;
        Real fR1 = fC3 * fC1 - ((Real)4.0) * fC0;
        Real fR2 = -fC2;
        Polynomial<Real> tempCubic;
        tempCubic.setCoefficient(0, fR0);
        tempCubic.setCoefficient(1, fR1);
        tempCubic.setCoefficient(2, fR2);
        tempCubic.setCoefficient(3, 1.0);
        std::vector<Real> cubeRoots = tempCubic.FindRealRoots();  // always
        // produces
        // at
        // least
        // one
        // root
        Real fY = cubeRoots[0];

        Real fDiscr = ((Real)0.25) * fC3 * fC3 - fC2 + fY;
        if (fabs(fDiscr) <= fEpsilon) { fDiscr = (Real)0.0; }

        if (fDiscr > (Real)0.0) {
          Real fR  = sqrt(fDiscr);
          Real fT1 = ((Real)0.75) * fC3 * fC3 - fR * fR - ((Real)2.0) * fC2;
          Real fT2 =
              (((Real)4.0) * fC3 * fC2 - ((Real)8.0) * fC1 - fC3 * fC3 * fC3) /
              (((Real)4.0) * fR);

          Real fTplus  = fT1 + fT2;
          Real fTminus = fT1 - fT2;
          if (fabs(fTplus) <= fEpsilon) { fTplus = (Real)0.0; }
          if (fabs(fTminus) <= fEpsilon) { fTminus = (Real)0.0; }

          if (fTplus >= (Real)0.0) {
            Real fD = sqrt(fTplus);
            roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * (fR + fD));
            roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * (fR - fD));
          }
          if (fTminus >= (Real)0.0) {
            Real fE = sqrt(fTminus);
            roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * (fE - fR));
            roots.push_back(-((Real)0.25) * fC3 - ((Real)0.5) * (fE + fR));
          }
        } else if (fDiscr < (Real)0.0) {
          // roots.clear();
        } else {
          Real fT2 = fY * fY - ((Real)4.0) * fC0;
          if (fT2 >= -fEpsilon) {
            if (fT2 < (Real)0.0) {  // round to zero
              fT2 = (Real)0.0;
            }
            fT2      = ((Real)2.0) * sqrt(fT2);
            Real fT1 = ((Real)0.75) * fC3 * fC3 - ((Real)2.0) * fC2;
            if (fT1 + fT2 >= fEpsilon) {
              Real fD = sqrt(fT1 + fT2);
              roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * fD);
              roots.push_back(-((Real)0.25) * fC3 - ((Real)0.5) * fD);
            }
            if (fT1 - fT2 >= fEpsilon) {
              Real fE = sqrt(fT1 - fT2);
              roots.push_back(-((Real)0.25) * fC3 + ((Real)0.5) * fE);
              roots.push_back(-((Real)0.25) * fC3 - ((Real)0.5) * fE);
            }
          }
        }
      }
        return roots;
      default: {
        DynamicRectMatrix<Real> companion = CreateCompanion();
        JAMA::Eigenvalue<Real> eig(companion);
        DynamicVector<Real> reals, imags;
        eig.getRealEigenvalues(reals);
        eig.getImagEigenvalues(imags);

        for (int i = 0; i < deg; i++) {
          if (fabs(imags(i)) < fEpsilon) roots.push_back(reals(i));
        }
      }
        return roots;
      }
    }